

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

size_t __thiscall
kj::_::Delimited<kj::ArrayPtr<const_int>_>::size(Delimited<kj::ArrayPtr<const_int>_> *this)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  
  ensureStringifiedInitialized(this);
  bVar3 = true;
  sVar1 = 0;
  for (lVar2 = 0; (this->stringified).size_ * 0x18 - lVar2 != 0; lVar2 = lVar2 + 0x18) {
    lVar4 = (this->delimiter).content.size_ - 1;
    if (bVar3) {
      lVar4 = 0;
    }
    sVar1 = sVar1 + *(long *)(((this->stringified).ptr)->content + lVar2 + -8) + lVar4;
    bVar3 = false;
  }
  return sVar1;
}

Assistant:

size_t size() {
    ensureStringifiedInitialized();

    size_t result = 0;
    bool first = true;
    for (auto& e: stringified) {
      if (first) {
        first = false;
      } else {
        result += delimiter.size();
      }
      result += e.size();
    }
    return result;
  }